

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

void trb_print_family_tree(trt_wrapper wr,trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  ly_bool lVar1;
  uint32_t max_gap_before_type;
  long lVar2;
  trt_node *ptVar3;
  trt_node *ptVar4;
  ulong uVar5;
  byte bVar6;
  trt_parent_cache tVar7;
  trt_parent_cache tVar8;
  trt_parent_cache ca;
  trt_node node;
  trt_node local_f0;
  trt_node local_90;
  
  bVar6 = 0;
  if ((&tc->pn)[(ulong)(tc->lysc_tree != '\0') * 2] != (lysp_node *)0x0) {
    uVar5 = 0x1000400000000;
    max_gap_before_type = trb_max_gap_to_type((trt_parent_cache)ZEXT816(0x1000400000000),pc,tc);
    if (((tc->lysc_tree == '\0') && (tc->section == TRD_SECT_GROUPING)) &&
       (tc->tpn == tc->pn->parent)) {
      uVar5 = 0x400000000;
    }
    tVar7.last_list = (lysp_node_list *)0x0;
    tVar7.ancestor = (int)uVar5;
    tVar7.lys_status = (short)(uVar5 >> 0x20);
    tVar7.lys_config = (short)(uVar5 >> 0x30);
    (*(pc->fp).modify.first_sibling)(&local_90,tVar7,tc);
    while (lVar1 = trp_node_is_empty(&local_90), lVar1 == '\0') {
      ly_print_(pc->out,"\n");
      ca.last_list = (lysp_node_list *)0x0;
      ca.ancestor = (int)uVar5;
      ca.lys_status = (short)(uVar5 >> 0x20);
      ca.lys_config = (short)(uVar5 >> 0x30);
      trb_print_subtree_nodes(&local_90,max_gap_before_type,wr,ca,pc,tc);
      tVar8.last_list = (lysp_node_list *)0x0;
      tVar8.ancestor = (int)uVar5;
      tVar8.lys_status = (short)(uVar5 >> 0x20);
      tVar8.lys_config = (short)(uVar5 >> 0x30);
      (*(pc->fp).modify.next_sibling)(&local_f0,tVar8,tc);
      ptVar3 = &local_f0;
      ptVar4 = &local_90;
      for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
        ptVar4->status = ptVar3->status;
        ptVar3 = (trt_node *)((long)ptVar3 + (ulong)bVar6 * -0x10 + 8);
        ptVar4 = (trt_node *)((long)ptVar4 + (ulong)bVar6 * -0x10 + 8);
      }
    }
  }
  return;
}

Assistant:

static void
trb_print_family_tree(struct trt_wrapper wr, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    struct trt_parent_cache ca;
    struct trt_node node;
    uint32_t max_gap_before_type;

    if (!tro_tree_ctx_get_node(tc)) {
        return;
    }

    ca = TRP_EMPTY_PARENT_CACHE;
    max_gap_before_type = trb_try_unified_indent(ca, pc, tc);

    if (!tc->lysc_tree) {
        if ((tc->section == TRD_SECT_GROUPING) && (tc->tpn == tc->pn->parent)) {
            ca.lys_config = 0x0;
        }
    }

    for (node = pc->fp.modify.first_sibling(ca, tc);
            !trp_node_is_empty(&node);
            node = pc->fp.modify.next_sibling(ca, tc)) {
        ly_print_(pc->out, "\n");
        trb_print_subtree_nodes(&node, max_gap_before_type, wr, ca, pc, tc);
    }
}